

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

pair<bool,_bool> __thiscall
kratos::Generator::correct_wire_direction
          (Generator *this,shared_ptr<kratos::Var> *var1,shared_ptr<kratos::Var> *var2)

{
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  bool bVar1;
  VarType VVar2;
  int iVar3;
  uint uVar4;
  PortDirection PVar5;
  UserException *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  VarException *pVVar6;
  undefined4 extraout_var_01;
  char (*pacVar7) [27];
  element_type *peVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  Port *local_450;
  Port *local_440;
  bool local_3ea;
  bool local_3e9;
  InterfacePort *local_3e8;
  bool local_392;
  bool local_391;
  InterfacePort *local_390;
  long local_380;
  Var *local_370;
  Port *port2_1;
  Port *port1_1;
  InterfacePort *local_330;
  InterfacePort **local_328;
  size_type local_320;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_318;
  remove_reference_t<std::__cxx11::basic_string<char>_&> local_300;
  string local_2e0;
  enable_shared_from_this<kratos::Generator> local_2c0;
  bool local_2aa;
  bool local_2a9;
  InterfaceRef *local_2a8;
  InterfaceRef *ref_1;
  InterfacePort *port_i_1;
  InterfacePort *pIStack_290;
  bool flip_dir_1;
  Port *port2;
  InterfacePort *local_280;
  InterfacePort **local_278;
  size_type local_270;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_268;
  remove_reference_t<std::__cxx11::basic_string<char>_&> local_250;
  string local_230;
  enable_shared_from_this<kratos::Generator> local_210;
  bool local_1fa;
  bool local_1f9;
  InterfaceRef *local_1f8;
  InterfaceRef *ref;
  InterfacePort *port_i;
  InterfacePort *pIStack_1e0;
  bool flip_dir;
  Port *port1;
  long local_1d0;
  VarSlice *var_1;
  Var *root2;
  VarSlice *var;
  Var *root1;
  allocator<char> local_199;
  string local_198;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *local_178;
  shared_ptr<kratos::Var> *var2_local;
  shared_ptr<kratos::Var> *var1_local;
  Generator *this_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_158;
  basic_string_view<char> local_148;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_108;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *local_f8;
  char (*local_f0) [27];
  char *local_e8;
  string *local_e0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_d8;
  basic_string_view<char> local_c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *local_78;
  char (*local_70) [27];
  char *local_68;
  string *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_178 = &var2->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
  var2_local = var1;
  var1_local = (shared_ptr<kratos::Var> *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)var1);
  if ((bVar1) &&
     (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_178), bVar1)) {
    var = (VarSlice *)
          std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                    (&var2_local->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
    while (VVar2 = Var::type(&var->super_Var), VVar2 == Slice) {
      if (var == (VarSlice *)0x0) {
        local_370 = (Var *)0x0;
      }
      else {
        local_370 = (Var *)__dynamic_cast(var,&Var::typeinfo,&VarSlice::typeinfo,0);
      }
      root2 = local_370;
      var = (VarSlice *)local_370[1].super_IRNode._vptr_IRNode;
    }
    var_1 = (VarSlice *)std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get(local_178);
    while (VVar2 = Var::type(&var_1->super_Var), VVar2 == Slice) {
      if (var_1 == (VarSlice *)0x0) {
        local_380 = 0;
      }
      else {
        local_380 = __dynamic_cast(var_1,&Var::typeinfo,&VarSlice::typeinfo,0);
      }
      local_1d0 = local_380;
      var_1 = *(VarSlice **)(local_380 + 0x270);
    }
    VVar2 = Var::type(&var->super_Var);
    if ((VVar2 == PortIO) || (VVar2 = Var::type(&var_1->super_Var), VVar2 == PortIO)) {
      VVar2 = Var::type(&var->super_Var);
      if ((VVar2 == PortIO) && (VVar2 = Var::type(&var_1->super_Var), VVar2 != PortIO)) {
        if (var == (VarSlice *)0x0) {
          local_390 = (InterfacePort *)0x0;
        }
        else {
          local_390 = (InterfacePort *)__dynamic_cast(var,&Var::typeinfo,&Port::typeinfo,0);
        }
        pIStack_1e0 = local_390;
        iVar3 = (*(local_390->super_Port).super_Var.super_IRNode._vptr_IRNode[0xd])();
        if ((Generator *)CONCAT44(extraout_var,iVar3) == this) {
          port_i._7_1_ = 0;
          uVar4 = (*(pIStack_1e0->super_Port).super_Var.super_IRNode._vptr_IRNode[0x1d])();
          if ((uVar4 & 1) != 0) {
            ref = (InterfaceRef *)pIStack_1e0;
            local_1f8 = InterfacePort::interface(pIStack_1e0);
            bVar1 = InterfaceRef::is_port(local_1f8);
            local_391 = false;
            if (bVar1) {
              iVar3 = (*(var_1->super_Var).super_IRNode._vptr_IRNode[0xd])();
              local_391 = (Generator *)CONCAT44(extraout_var_00,iVar3) == this;
            }
            port_i._7_1_ = (local_391 ^ 0xffU) & 1;
          }
          if ((port_i._7_1_ & 1) == 0) {
            PVar5 = Port::port_direction(&pIStack_1e0->super_Port);
            local_392 = PVar5 == Out;
          }
          else {
            PVar5 = Port::port_direction(&pIStack_1e0->super_Port);
            local_392 = PVar5 == In;
          }
          local_1f9 = local_392;
          local_1fa = true;
          std::pair<bool,_bool>::pair<bool,_bool,_true>
                    ((pair<bool,_bool> *)((long)&this_local + 6),&local_1f9,&local_1fa);
        }
        else {
          (*(pIStack_1e0->super_Port).super_Var.super_IRNode._vptr_IRNode[0xd])();
          std::enable_shared_from_this<kratos::Generator>::shared_from_this(&local_210);
          bVar1 = has_child_generator(this,(shared_ptr<kratos::Generator> *)&local_210);
          std::shared_ptr<kratos::Generator>::~shared_ptr
                    ((shared_ptr<kratos::Generator> *)&local_210);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            port2._6_1_ = 1;
            pVVar6 = (VarException *)__cxa_allocate_exception(0x10);
            iVar3 = (*(pIStack_1e0->super_Port).super_Var.super_IRNode._vptr_IRNode[0xd])();
            pacVar7 = (char (*) [27])(CONCAT44(extraout_var_01,iVar3) + 0x78);
            peVar8 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)var2_local);
            (*(peVar8->super_IRNode)._vptr_IRNode[0x1f])(&local_250);
            vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&this->name;
            local_60 = &local_230;
            local_68 = "{0}.{1} is not part of {2}";
            local_78 = &local_250;
            local_70 = pacVar7;
            fmt::v7::
            make_args_checked<std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string&,char[27],char>
                      (&local_b8,(v7 *)"{0}.{1} is not part of {2}",pacVar7,local_78,
                       (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs,
                       (remove_reference_t<std::__cxx11::basic_string<char>_&> *)in_R9.values_);
            local_88 = &local_b8;
            local_c8 = fmt::v7::to_string_view<char,_0>(local_68);
            local_50 = &local_d8;
            local_58 = local_88;
            local_20 = local_88;
            local_10 = local_88;
            local_18 = local_50;
            fmt::v7::
            basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            ::basic_format_args(local_50,0xddd,
                                (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                 *)local_88);
            format_str.size_ = local_d8.desc_;
            format_str.data_ = (char *)local_c8.size_;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ = in_R9.values_;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)local_d8.field_1.values_;
            fmt::v7::detail::vformat_abi_cxx11_(&local_230,(detail *)local_c8.data_,format_str,args)
            ;
            local_280 = pIStack_1e0;
            local_278 = &local_280;
            local_270 = 1;
            std::allocator<const_kratos::IRNode_*>::allocator
                      ((allocator<const_kratos::IRNode_*> *)((long)&port2 + 7));
            __l_00._M_len = local_270;
            __l_00._M_array = (iterator)local_278;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      (&local_268,__l_00,(allocator<const_kratos::IRNode_*> *)((long)&port2 + 7));
            VarException::VarException(pVVar6,&local_230,&local_268);
            port2._6_1_ = 0;
            __cxa_throw(pVVar6,&VarException::typeinfo,VarException::~VarException);
          }
          PVar5 = Port::port_direction(&pIStack_1e0->super_Port);
          port2._5_1_ = PVar5 == In;
          port2._4_1_ = 1;
          std::pair<bool,_bool>::pair<bool,_bool,_true>
                    ((pair<bool,_bool> *)((long)&this_local + 6),(bool *)((long)&port2 + 5),
                     (bool *)((long)&port2 + 4));
        }
      }
      else {
        VVar2 = Var::type(&var_1->super_Var);
        if ((VVar2 == PortIO) && (VVar2 = Var::type(&var->super_Var), VVar2 != PortIO)) {
          if (var_1 == (VarSlice *)0x0) {
            local_3e8 = (InterfacePort *)0x0;
          }
          else {
            local_3e8 = (InterfacePort *)__dynamic_cast(var_1,&Var::typeinfo,&Port::typeinfo,0);
          }
          pIStack_290 = local_3e8;
          iVar3 = (*(local_3e8->super_Port).super_Var.super_IRNode._vptr_IRNode[0xd])();
          if ((Generator *)CONCAT44(extraout_var_02,iVar3) == this) {
            port_i_1._7_1_ = 0;
            uVar4 = (*(pIStack_290->super_Port).super_Var.super_IRNode._vptr_IRNode[0x1d])();
            if ((uVar4 & 1) != 0) {
              ref_1 = (InterfaceRef *)pIStack_290;
              local_2a8 = InterfacePort::interface(pIStack_290);
              bVar1 = InterfaceRef::is_port(local_2a8);
              local_3e9 = false;
              if (bVar1) {
                iVar3 = (*(var->super_Var).super_IRNode._vptr_IRNode[0xd])();
                local_3e9 = (Generator *)CONCAT44(extraout_var_03,iVar3) == this;
              }
              port_i_1._7_1_ = (local_3e9 ^ 0xffU) & 1;
            }
            if ((port_i_1._7_1_ & 1) == 0) {
              PVar5 = Port::port_direction(&pIStack_290->super_Port);
              local_3ea = PVar5 == In;
            }
            else {
              PVar5 = Port::port_direction(&pIStack_290->super_Port);
              local_3ea = PVar5 == Out;
            }
            local_2a9 = local_3ea;
            local_2aa = true;
            std::pair<bool,_bool>::pair<bool,_bool,_true>
                      ((pair<bool,_bool> *)((long)&this_local + 6),&local_2a9,&local_2aa);
          }
          else {
            (*(pIStack_290->super_Port).super_Var.super_IRNode._vptr_IRNode[0xd])();
            std::enable_shared_from_this<kratos::Generator>::shared_from_this(&local_2c0);
            bVar1 = has_child_generator(this,(shared_ptr<kratos::Generator> *)&local_2c0);
            std::shared_ptr<kratos::Generator>::~shared_ptr
                      ((shared_ptr<kratos::Generator> *)&local_2c0);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              port1_1._6_1_ = 1;
              pVVar6 = (VarException *)__cxa_allocate_exception(0x10);
              iVar3 = (*(pIStack_290->super_Port).super_Var.super_IRNode._vptr_IRNode[0xd])();
              pacVar7 = (char (*) [27])(CONCAT44(extraout_var_04,iVar3) + 0x78);
              peVar8 = std::
                       __shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)var2_local);
              (*(peVar8->super_IRNode)._vptr_IRNode[0x1f])(&local_300);
              vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&this->name;
              local_e0 = &local_2e0;
              local_e8 = "{0}.{1} is not part of {2}";
              local_f8 = &local_300;
              local_f0 = pacVar7;
              fmt::v7::
              make_args_checked<std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string&,char[27],char>
                        (&local_138,(v7 *)"{0}.{1} is not part of {2}",pacVar7,local_f8,
                         (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs_1,
                         (remove_reference_t<std::__cxx11::basic_string<char>_&> *)in_R9.values_);
              local_108 = &local_138;
              local_148 = fmt::v7::to_string_view<char,_0>(local_e8);
              local_40 = &local_158;
              local_48 = local_108;
              local_38 = local_108;
              local_28 = local_108;
              local_30 = local_40;
              fmt::v7::
              basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              ::basic_format_args(local_40,0xddd,
                                  (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                   *)local_108);
              format_str_00.size_ = local_158.desc_;
              format_str_00.data_ = (char *)local_148.size_;
              args_00.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .field_1.values_ = in_R9.values_;
              args_00.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .desc_ = (unsigned_long_long)local_158.field_1.values_;
              fmt::v7::detail::vformat_abi_cxx11_
                        (&local_2e0,(detail *)local_148.data_,format_str_00,args_00);
              local_330 = pIStack_290;
              local_328 = &local_330;
              local_320 = 1;
              std::allocator<const_kratos::IRNode_*>::allocator
                        ((allocator<const_kratos::IRNode_*> *)((long)&port1_1 + 7));
              __l._M_len = local_320;
              __l._M_array = (iterator)local_328;
              std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                        (&local_318,__l,(allocator<const_kratos::IRNode_*> *)((long)&port1_1 + 7));
              VarException::VarException(pVVar6,&local_2e0,&local_318);
              port1_1._6_1_ = 0;
              __cxa_throw(pVVar6,&VarException::typeinfo,VarException::~VarException);
            }
            PVar5 = Port::port_direction(&pIStack_290->super_Port);
            port1_1._5_1_ = PVar5 == Out;
            port1_1._4_1_ = 1;
            std::pair<bool,_bool>::pair<bool,_bool,_true>
                      ((pair<bool,_bool> *)((long)&this_local + 6),(bool *)((long)&port1_1 + 5),
                       (bool *)((long)&port1_1 + 4));
          }
        }
        else {
          if (var == (VarSlice *)0x0) {
            local_440 = (Port *)0x0;
          }
          else {
            local_440 = (Port *)__dynamic_cast(var,&Var::typeinfo,&Port::typeinfo,0);
          }
          if (var_1 == (VarSlice *)0x0) {
            local_450 = (Port *)0x0;
          }
          else {
            local_450 = (Port *)__dynamic_cast(var_1,&Var::typeinfo,&Port::typeinfo,0);
          }
          this_local._6_2_ = correct_port_direction(local_440,local_450,this);
        }
      }
    }
    else {
      port1._7_1_ = 1;
      port1._6_1_ = 1;
      std::pair<bool,_bool>::pair<bool,_bool,_true>
                ((pair<bool,_bool> *)((long)&this_local + 6),(bool *)((long)&port1 + 7),
                 (bool *)((long)&port1 + 6));
    }
    return this_local._6_2_;
  }
  root1._3_1_ = 1;
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"Variable cannot be null (None)",&local_199);
  UserException::UserException(this_00,&local_198);
  root1._3_1_ = 0;
  __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
}

Assistant:

std::pair<bool, bool> Generator::correct_wire_direction(const std::shared_ptr<Var> &var1,
                                                        const std::shared_ptr<Var> &var2) {
    if (!var1 || !var2) throw UserException("Variable cannot be null (None)");
    Var *root1 = var1.get();
    while (root1->type() == VarType::Slice) {
        auto *var = dynamic_cast<VarSlice *>(root1);
        root1 = var->parent_var;
    }
    Var *root2 = var2.get();
    while (root2->type() == VarType::Slice) {
        auto *var = dynamic_cast<VarSlice *>(root2);
        root2 = var->parent_var;
    }
    if (root1->type() != VarType::PortIO && root2->type() != VarType::PortIO) {
        // there is nothing we can do
        return {true, true};
    } else if (root1->type() == VarType::PortIO && root2->type() != VarType::PortIO) {
        // var1 is port and var2 is not
        auto *port1 = dynamic_cast<Port *>(root1);
        if (port1->generator() == this) {
            bool flip_dir = false;
            if (port1->is_interface()) {
                auto *port_i = reinterpret_cast<InterfacePort *>(port1);
                const auto *ref = port_i->interface();
                flip_dir = !(ref->is_port() && root2->generator() == this);
            }
            return {!flip_dir ? port1->port_direction() == PortDirection::Out
                              : port1->port_direction() == PortDirection::In,
                    true};
        } else {
            if (!has_child_generator(port1->generator()->shared_from_this())) {
                throw VarException(::format("{0}.{1} is not part of {2}", port1->generator()->name,
                                            var1->to_string(), name),
                                   {port1});
            }
            // child generator, reverse order
            return {port1->port_direction() == PortDirection::In, true};
        }
    } else if (root2->type() == VarType::PortIO && root1->type() != VarType::PortIO) {
        // var2 is port and var1 is not
        auto *port2 = dynamic_cast<Port *>(root2);
        if (port2->generator() == this) {
            bool flip_dir = false;
            if (port2->is_interface()) {
                auto *port_i = reinterpret_cast<InterfacePort *>(port2);
                const auto *ref = port_i->interface();
                flip_dir = !(ref->is_port() && root1->generator() == this);
            }
            return {!flip_dir ? port2->port_direction() == PortDirection::In
                              : port2->port_direction() == PortDirection::Out,
                    true};
        } else {
            if (!has_child_generator(port2->generator()->shared_from_this())) {
                throw VarException(::format("{0}.{1} is not part of {2}", port2->generator()->name,
                                            var1->to_string(), name),
                                   {port2});
            }
            // child generator, reverse order
            return {port2->port_direction() == PortDirection::Out, true};
        }
    } else {
        // both are ports
        auto *port1 = dynamic_cast<Port *>(root1);
        auto *port2 = dynamic_cast<Port *>(root2);
        return correct_port_direction(port1, port2, this);
    }
}